

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

char ** VW::get_argv_from_string(string *s,int *argc)

{
  char *__ptr;
  char **ppcVar1;
  char *__dest;
  ulong uVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  substring s_00;
  vector<substring,_std::allocator<substring>_> foo;
  
  __ptr = calloc_or_throw<char>(s->_M_string_length + 3);
  __ptr[0] = 'b';
  __ptr[1] = ' ';
  strcpy(__ptr + 2,(s->_M_dataplus)._M_p);
  foo.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  foo.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  foo.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  s_00.end = __ptr + 2 + s->_M_string_length;
  s_00.begin = __ptr;
  tokenize<std::vector<substring,std::allocator<substring>>>(' ',s_00,&foo,false);
  ppcVar1 = calloc_or_throw<char*>
                      ((long)foo.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)foo.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
                             super__Vector_impl_data._M_start >> 4);
  lVar3 = 0;
  uVar4 = 0;
  while( true ) {
    uVar2 = (long)foo.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)foo.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
                  super__Vector_impl_data._M_start >> 4;
    if (uVar2 <= uVar4) break;
    **(undefined1 **)
      ((long)&(foo.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
               super__Vector_impl_data._M_start)->end + lVar3) = 0;
    __dest = calloc_or_throw<char>
                       ((*(long *)((long)&(foo.
                                           super__Vector_base<substring,_std::allocator<substring>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->end + lVar3)
                        - *(long *)((long)&(foo.
                                            super__Vector_base<substring,_std::allocator<substring>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->begin +
                                   lVar3)) + 1);
    ppcVar1[uVar4] = __dest;
    strcpy(__dest,*(char **)((long)&(foo.super__Vector_base<substring,_std::allocator<substring>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->begin + lVar3));
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x10;
  }
  *argc = (int)uVar2;
  free(__ptr);
  std::_Vector_base<substring,_std::allocator<substring>_>::~_Vector_base
            (&foo.super__Vector_base<substring,_std::allocator<substring>_>);
  return ppcVar1;
}

Assistant:

char** get_argv_from_string(string s, int& argc)
{
  char* c = calloc_or_throw<char>(s.length() + 3);
  c[0] = 'b';
  c[1] = ' ';
  strcpy(c + 2, s.c_str());
  substring ss = {c, c + s.length() + 2};
  std::vector<substring> foo;
  tokenize(' ', ss, foo);

  char** argv = calloc_or_throw<char*>(foo.size());
  for (size_t i = 0; i < foo.size(); i++)
  {
    *(foo[i].end) = '\0';
    argv[i] = calloc_or_throw<char>(foo[i].end - foo[i].begin + 1);
    sprintf(argv[i], "%s", foo[i].begin);
  }

  argc = (int)foo.size();
  free(c);
  return argv;
}